

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference
               (IfcPolygonalBoundedHalfSpace *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  double *pdVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 *puVar12;
  bool bVar13;
  bool bVar14;
  IfcSurface *pIVar15;
  IfcPlane *pIVar16;
  IfcAxis2Placement3D *pIVar17;
  Lazy *this;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  TempMesh *__p;
  IfcBoundedCurve *curve;
  uint *puVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *pvVar22;
  aiVector3t<double> *paVar23;
  long lVar24;
  ulong uVar25;
  double dVar26;
  bool bVar27;
  bool bVar28;
  IfcMatrix4 *pIVar29;
  IfcVector3 *__x;
  aiMatrix4x4t<double> *paVar30;
  vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *this_00;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *pvVar31;
  pointer paVar32;
  undefined8 *puVar33;
  size_t a_1;
  IfcVector3 *pIVar34;
  size_t b;
  undefined1 *this_01;
  byte bVar35;
  undefined4 uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  char *unaff_retaddr;
  IfcVector3 e1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> blackside;
  IfcVector3 ei;
  IfcVector3 startingPoint;
  IfcVector3 polyNormal;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  double local_2f8;
  IfcVector3 nextBoundaryPoint;
  IfcVector3 e1_1;
  IfcVector3 local_2a8;
  ulong local_290;
  double local_288;
  double local_280;
  undefined1 local_278 [16];
  double local_268;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> whiteside;
  IfcVector3 e0;
  IfcVector3 p;
  IfcVector3 profileNormal;
  IfcMatrix4 proj_inv;
  double dStack_f0;
  double dStack_d0;
  IfcMatrix4 proj;
  
  bVar35 = 0;
  if (hs == (IfcPolygonalBoundedHalfSpace *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x187,
                  "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar15 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcSurface> *)
                       &(hs->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                        field_0x30);
  pIVar16 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPlane>
                      ((Object *)
                       ((long)&(pIVar15->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper +
                       (long)(pIVar15->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper[-3]));
  if (pIVar16 == (IfcPlane *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  p.x = 0.0;
  p.y = 0.0;
  p.z = 0.0;
  local_2a8.x = 0.0;
  local_2a8.y = 0.0;
  local_2a8.z = 1.0;
  this_01 = &(pIVar16->super_IfcElementarySurface).super_IfcSurface.field_0x40;
  pIVar17 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_01);
  if (pIVar17->field_0x50 == '\x01') {
    pIVar17 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_01);
    this = (Lazy *)STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                             ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                              &(pIVar17->super_IfcPlacement).field_0x48);
    in = STEP::Lazy::operator_cast_to_IfcDirection_(this);
    ConvertDirection(&local_2a8,in);
  }
  pIVar17 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_01);
  in_00 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                    ((Lazy *)&(pIVar17->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                              field_0x30);
  ConvertCartesianPoint(&p,in_00);
  STEP::EXPRESS::ENUMERATION::ENUMERATION
            ((ENUMERATION *)&proj_inv,&(hs->super_IfcHalfSpaceSolid).AgreementFlag);
  bVar13 = IsTrue((BOOLEAN *)&proj_inv);
  STEP::EXPRESS::
  PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~PrimitiveDataType
            ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&proj_inv);
  if (!bVar13) {
    local_2a8.x = -local_2a8.x;
    local_2a8.y = -local_2a8.y;
    local_2a8.z = -local_2a8.z;
  }
  aiVector3t<double>::Normalize(&local_2a8);
  __p = (TempMesh *)operator_new(0x30);
  (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IFC::TempMesh,void>
            ((__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2> *)&profile,__p);
  curve = STEP::Lazy::operator_cast_to_IfcBoundedCurve_((Lazy *)&hs->PolygonalBoundary);
  bVar13 = ProcessCurve(&curve->super_IfcCurve,
                        profile.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,conv);
  if (bVar13) {
    pIVar34 = ((profile.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    TempMesh::ComputePolygonNormal
              (&profileNormal,pIVar34,
               ((long)((profile.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar34) / 0x18,true);
    proj_inv.a1 = 1.0;
    proj_inv.a2 = 0.0;
    proj_inv.a3 = 0.0;
    proj_inv.a4 = 0.0;
    proj_inv.b1 = 0.0;
    proj_inv.b2 = 1.0;
    proj_inv.b3 = 0.0;
    proj_inv.b4 = 0.0;
    proj_inv.c1 = 0.0;
    proj_inv.c2 = 0.0;
    proj_inv.c3 = 1.0;
    proj_inv.c4 = 0.0;
    proj_inv.d1 = 0.0;
    proj_inv.d2 = 0.0;
    proj_inv.d3 = 0.0;
    proj_inv.d4 = 1.0;
    pIVar17 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                        ((Lazy *)&(hs->super_IfcHalfSpaceSolid).field_0x68);
    ConvertAxisPlacement(&proj_inv,pIVar17);
    pIVar29 = &proj_inv;
    paVar30 = &proj;
    for (lVar24 = 0x10; lVar24 != 0; lVar24 = lVar24 + -1) {
      paVar30->a1 = pIVar29->a1;
      pIVar29 = (IfcMatrix4 *)((long)pIVar29 + (ulong)bVar35 * -0x10 + 8);
      paVar30 = (aiMatrix4x4t<double> *)((long)paVar30 + (ulong)bVar35 * -0x10 + 8);
    }
    aiMatrix4x4t<double>::Inverse(&proj);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,
               ((long)(first_operand->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(first_operand->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&result->mVertcnt,
               (long)(first_operand->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(first_operand->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    puVar18 = (first_operand->mVertcnt).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (first_operand->mVertcnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_290 = 0;
    for (; puVar18 != puVar2; puVar18 = puVar18 + 1) {
      whiteside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      blackside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      whiteside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      whiteside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      blackside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      blackside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar19 = (ulong)*puVar18;
      if (uVar19 != 0) {
        pIVar34 = (first_operand->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + local_290;
        TempMesh::ComputePolygonNormal(&polyNormal,pIVar34,uVar19,true);
        dVar9 = (pIVar34->z - p.z) * local_2a8.z +
                (pIVar34->x - p.x) * local_2a8.x + (pIVar34->y - p.y) * local_2a8.y;
        bVar13 = -1e-06 < dVar9;
        if (ABS(polyNormal.z * local_2a8.z + polyNormal.x * local_2a8.x + polyNormal.y * local_2a8.y
               ) <= 0.9999) {
          __x = pIVar34;
          for (uVar25 = 1; uVar25 - uVar19 != 1; uVar25 = uVar25 + 1) {
            e0.z = __x->z;
            e0.x = __x->x;
            e0.y = __x->y;
            uVar20 = 0;
            if (uVar25 != uVar19) {
              uVar20 = uVar25;
            }
            e1.z = pIVar34[uVar20].z;
            e1.x = pIVar34[uVar20].x;
            e1.y = pIVar34[uVar20].y;
            ei.x = 0.0;
            ei.y = 0.0;
            ei.z = 0.0;
            pvVar31 = &blackside;
            if (bVar13) {
              pvVar31 = &whiteside;
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (pvVar31,__x);
            bVar14 = IntersectSegmentPlane(&p,&local_2a8,&e0,&e1,bVar13,&ei);
            if (bVar14) {
              pvVar22 = &blackside;
              if (bVar13 != false) {
                pvVar22 = &whiteside;
              }
              paVar32 = (pvVar22->
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (((pvVar31->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_start == paVar32) ||
                 (dVar9 = paVar32[-1].x - ei.x, dVar40 = paVar32[-1].y - ei.y,
                 dVar37 = paVar32[-1].z - ei.z,
                 1e-12 < dVar37 * dVar37 + dVar9 * dVar9 + dVar40 * dVar40)) {
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                          (pvVar31,&ei);
              }
              pvVar31 = &whiteside;
              if (bVar13 != false) {
                pvVar31 = &blackside;
              }
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                        (pvVar31,&ei);
              bVar13 = (bool)(bVar13 ^ 1);
            }
            __x = __x + 1;
          }
        }
        else {
          this_00 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&blackside;
          if (-1e-06 < dVar9) {
            this_00 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&whiteside;
          }
          pvVar31 = &blackside;
          if (-1e-06 < dVar9) {
            pvVar31 = &whiteside;
          }
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          insert<aiVector3t<double>const*,void>
                    (this_00,(pvVar31->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,pIVar34,pIVar34 + uVar19);
        }
        WritePolygon(&whiteside,result);
        FilterPolygon(&blackside);
        if (blackside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            blackside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          e1.x = 0.0;
          e1.y = 0.0;
          e1.z = 0.0;
          ::operator*(&proj,blackside.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          bVar14 = PointInPoly(&polyNormal,
                               &(profile.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->mVerts);
          ei.z = 0.0;
          ei.x = 0.0;
          ei.y = 0.0;
          uVar19 = 0;
          bVar13 = bVar14;
          while (uVar19 < (ulong)(((long)blackside.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)blackside.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
            ::operator*(&proj,blackside.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar19);
            uVar19 = uVar19 + 1;
            ::operator*(&proj,blackside.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              uVar19 % (ulong)(((long)blackside.
                                                                                                            
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)blackside.
                                                                                                          
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                       );
            if (ei.y != ei.x) {
              ei.y = ei.x;
            }
            IntersectsBoundaryProfile
                      (&e0,&e1_1,
                       &(profile.
                         super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->mVerts,bVar13,
                       (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                        *)&ei,false);
            if (0x20 < (ulong)((long)ei.y - (long)ei.x)) {
              uVar25 = 0;
              bVar27 = false;
LAB_004e4fa7:
              do {
                bVar28 = bVar27;
                puVar12 = (undefined8 *)(uVar25 * 0x20 + (long)ei.x);
                while (puVar33 = puVar12, uVar25 < ((long)ei.y - (long)ei.x >> 5) - 1U) {
                  puVar12 = puVar33 + 4;
                  uVar25 = uVar25 + 1;
                  if (((double)puVar33[7] - e0.z) * ((double)puVar33[7] - e0.z) +
                      ((double)puVar33[5] - e0.x) * ((double)puVar33[5] - e0.x) +
                      ((double)puVar33[6] - e0.y) * ((double)puVar33[6] - e0.y) <
                      ((double)puVar33[3] - e0.z) * ((double)puVar33[3] - e0.z) +
                      ((double)puVar33[1] - e0.x) * ((double)puVar33[1] - e0.x) +
                      ((double)puVar33[2] - e0.y) * ((double)puVar33[2] - e0.y)) {
                    uVar3 = *puVar12;
                    *puVar12 = *puVar33;
                    *puVar33 = uVar3;
                    polyNormal.z = (double)puVar33[7];
                    polyNormal.x = (double)puVar33[5];
                    polyNormal.y = (double)puVar33[6];
                    puVar33[7] = puVar33[3];
                    puVar33[5] = puVar33[1];
                    puVar33[6] = puVar33[2];
                    puVar33[3] = polyNormal.z;
                    puVar33[1] = polyNormal.x;
                    puVar33[2] = polyNormal.y;
                    bVar27 = true;
                    goto LAB_004e4fa7;
                  }
                }
                uVar25 = 0;
                bVar27 = false;
              } while (bVar28);
            }
            lVar24 = 8;
            for (uVar25 = 0; uVar25 < (ulong)((long)ei.y - (long)ei.x >> 5); uVar25 = uVar25 + 1) {
              ::operator*(&proj_inv,(aiVector3t<double> *)((long)ei.x + lVar24));
              polyNormal.x = *(double *)((long)ei.x + -8 + lVar24);
              polyNormal.y = startingPoint.x;
              polyNormal.z = startingPoint.y;
              std::
              vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
              ::emplace_back<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>
                        ((vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
                          *)&e1,(tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                &polyNormal);
              lVar24 = lVar24 + 0x20;
            }
            bVar13 = (bool)(bVar13 ^ (byte)(((uint)((long)ei.y - (long)ei.x) & 0x20) >> 5));
          }
          uVar19 = ((long)e1.y - (long)e1.x) / 0x28;
          if ((uVar19 & 1) == 0) {
            if (1 < uVar19) {
              if (!bVar14) {
                lVar24 = 0;
                uVar19 = 0xffffffffffffffff;
                while( true ) {
                  uVar25 = ((long)e1.y - (long)e1.x) / 0x28;
                  if (uVar25 - 1 <= uVar19 + 1) break;
                  std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>::swap
                            ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                             ((long)e1.x + lVar24),
                             (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                             (((uVar19 + uVar25) % uVar25) * 0x28 + (long)e1.x));
                  lVar24 = lVar24 + 0x28;
                  uVar19 = uVar19 + 1;
                }
              }
              uVar19 = 0;
              do {
                uVar20 = ((long)e1.y - (long)e1.x) / 0x28;
                lVar24 = uVar19 * 0x28;
                uVar25 = uVar19;
                do {
                  uVar19 = uVar25;
                  if (e1.y == e1.x) goto LAB_004e5e28;
                  if (uVar20 - 1 <= uVar19) {
                    if ((1 < uVar20) &&
                       (dVar9 = *(double *)((long)e1.y + -0x20) - *(double *)((long)e1.x + 8),
                       dVar40 = *(double *)((long)e1.y + -0x18) - *(double *)((long)e1.x + 0x10),
                       dVar37 = *(double *)((long)e1.y + -0x10) - *(double *)((long)e1.x + 0x18),
                       dVar37 * dVar37 + dVar9 * dVar9 + dVar40 * dVar40 < 1e-10)) {
                      e1.y = (double)((long)e1.y + -0x28);
                      std::
                      vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                               *)&e1,(const_iterator)e1.x);
                    }
                    goto LAB_004e5494;
                  }
                  lVar21 = ((uVar19 + 1) % uVar20) * 0x28;
                  dVar9 = *(double *)((long)e1.x + 8 + lVar24) -
                          *(double *)((long)e1.x + 8 + lVar21);
                  dVar40 = *(double *)((long)e1.x + 0x10 + lVar24) -
                           *(double *)((long)e1.x + 0x10 + lVar21);
                  dVar37 = *(double *)((long)e1.x + 0x18 + lVar24) -
                           *(double *)((long)e1.x + 0x18 + lVar21);
                  lVar24 = lVar24 + 0x28;
                  uVar25 = uVar19 + 1;
                } while (1e-10 <= dVar37 * dVar37 + dVar9 * dVar9 + dVar40 * dVar40);
                std::
                vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         *)&e1,(tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                               ((long)e1.x + lVar24 + -0x28),
                        (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                        ((long)e1.x + lVar24 + 0x28));
              } while( true );
            }
LAB_004e5494:
            dVar7 = proj.c3;
            dVar26 = proj.c2;
            dVar43 = proj.c1;
            dVar38 = proj.b3;
            dVar37 = proj.a3;
            dVar40 = proj.a2;
            dVar9 = proj.a1;
            if (e1.x == e1.y) {
LAB_004e5e28:
              if (!bVar14) {
                polyNormal.x = (double)CONCAT44(polyNormal.x._4_4_,
                                                (int)(((long)blackside.
                                                                                                                          
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)blackside.
                                                                                                                
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                                               );
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&result->mVertcnt,(uint *)&polyNormal);
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                           (result->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                            )blackside.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                            )blackside.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
            else {
              local_280 = proj.b1;
              local_288 = proj.b2;
              TempMesh::ComputePolygonNormal
                        (&polyNormal,
                         blackside.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)blackside.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)blackside.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18,true);
              dVar42 = dVar38 * polyNormal.z + local_280 * polyNormal.x + local_288 * polyNormal.y;
              dVar38 = polyNormal.z * dVar7 + polyNormal.x * dVar43 + polyNormal.y * dVar26;
              dVar40 = polyNormal.z * dVar37 + polyNormal.x * dVar9 + polyNormal.y * dVar40;
              local_288 = profileNormal.z * dVar38 +
                          profileNormal.x * dVar40 + profileNormal.y * dVar42;
              bVar13 = 0.0 <= local_288;
              dVar9 = *(double *)(&DAT_005c32e0 + (ulong)bVar13 * 8);
              uVar36 = (undefined4)((ulong)dVar38 >> 0x20);
              auVar4._8_4_ = SUB84(dVar38,0);
              auVar4._0_8_ = dVar38;
              auVar4._12_4_ = uVar36;
              auVar5._8_4_ = SUB84(dVar38,0);
              auVar5._0_8_ = dVar42;
              auVar5._12_4_ = uVar36;
              auVar6._8_4_ = SUB84(dVar42,0);
              auVar6._0_8_ = dVar42;
              auVar6._12_4_ = (int)((ulong)dVar42 >> 0x20);
              while (e1.x != e1.y) {
                e1_1.x = 0.0;
                e1_1.y = 0.0;
                e1_1.z = 0.0;
                uVar19 = 0;
                do {
                  if ((ulong)(((long)e1.y - (long)e1.x) / 0x28) <= uVar19 + 1) {
                    __assert_fail("intersections.size() > currentIntersecIdx + 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                                  ,0x26a,
                                  "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                                 );
                  }
                  pdVar1 = (double *)((long)e1.x + uVar19 * 0x28);
                  dVar37 = pdVar1[4];
                  polyNormal.x = *pdVar1;
                  polyNormal.y = pdVar1[1];
                  polyNormal.z = pdVar1[2];
                  lVar24 = (uVar19 + 1) * 0x28;
                  dVar43 = *(double *)((long)e1.x + 0x20 + lVar24);
                  e0.x = *(double *)((long)e1.x + lVar24);
                  e0.y = ((double *)((long)e1.x + lVar24))[1];
                  e0.z = *(double *)((long)e1.x + 0x10 + lVar24);
                  std::
                  vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                  ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                           *)&e1,(tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 ((long)e1.x + uVar19 * 0x28),
                          (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)(pdVar1 + 10));
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &e1_1,(value_type *)&polyNormal.y);
                  if ((ulong)dVar43 < (ulong)dVar37) {
                    lVar24 = ((long)blackside.
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)blackside.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
                  }
                  else {
                    lVar24 = 0;
                  }
                  for (uVar19 = 1; uVar19 <= (ulong)(((long)dVar43 - (long)dVar37) + lVar24);
                      uVar19 = uVar19 + 1) {
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &e1_1,blackside.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                                     ((long)dVar37 + uVar19) %
                                     (ulong)(((long)blackside.
                                                                                                        
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)blackside.
                                                                                                      
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                              );
                  }
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &e1_1,(value_type *)&e0.y);
                  ::operator*(&proj,(aiVector3t<double> *)&e0.y);
                  dVar37 = (double)(((long)e0.x + (ulong)bVar13) %
                                   (ulong)(((long)((profile.
                                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->mVerts).
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)((profile.
                                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->mVerts).
                                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18))
                  ;
                  uVar19 = 0xffffffffffffffff;
                  do {
                    if (uVar19 != 0xffffffffffffffff) goto LAB_004e5de6;
                    if (local_288 < 0.0) {
                      uVar19 = (long)dVar37 + 1;
                      paVar32 = ((profile.
                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar25 = ((long)((profile.
                                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->mVerts).
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar32) /
                               0x18;
                    }
                    else {
                      paVar32 = ((profile.
                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar25 = ((long)((profile.
                                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->mVerts).
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar32) /
                               0x18;
                      uVar19 = ((long)dVar37 + uVar25) - 1;
                    }
                    dVar26 = (double)(uVar19 % uVar25);
                    dVar43 = paVar32[(long)dVar37].z;
                    nextBoundaryPoint.x = paVar32[(long)dVar26].x;
                    nextBoundaryPoint.y = paVar32[(long)dVar26].y;
                    nextBoundaryPoint.z = paVar32[(long)dVar26].z;
                    if (1e-05 < ABS(dVar38)) {
                      auVar45._0_8_ = (paVar32[(long)dVar37].x - startingPoint.x) * dVar40;
                      auVar45._8_8_ = (nextBoundaryPoint.x - startingPoint.x) * dVar40;
                      auVar45 = divpd(auVar45,auVar4);
                      dStack_f0 = auVar6._8_8_;
                      auVar44._0_8_ = (paVar32[(long)dVar37].y - startingPoint.y) * dVar42;
                      auVar44._8_8_ = (nextBoundaryPoint.y - startingPoint.y) * dStack_f0;
                      auVar44 = divpd(auVar44,auVar4);
                      dVar43 = auVar44._0_8_ + startingPoint.z + auVar45._0_8_;
                      nextBoundaryPoint.z = auVar44._8_8_ + startingPoint.z + auVar45._8_8_;
                    }
                    dVar7 = nextBoundaryPoint.x - paVar32[(long)dVar37].x;
                    dVar10 = nextBoundaryPoint.y - paVar32[(long)dVar37].y;
                    local_268 = dVar7 * profileNormal.y - profileNormal.x * dVar10;
                    local_278._8_8_ =
                         profileNormal.x * (nextBoundaryPoint.z - dVar43) - dVar7 * profileNormal.z;
                    local_278._0_8_ =
                         profileNormal.z * dVar10 - (nextBoundaryPoint.z - dVar43) * profileNormal.y
                    ;
                    paVar23 = aiVector3t<double>::Normalize((aiVector3t<double> *)local_278);
                    dStack_d0 = auVar5._8_8_;
                    dVar43 = paVar23->z * dVar40 - paVar23->x * dStack_d0;
                    local_268 = paVar23->x * dVar42 - dVar40 * paVar23->y;
                    local_278._8_4_ = SUB84(dVar43,0);
                    local_278._0_8_ = paVar23->y * dVar38 - paVar23->z * dVar42;
                    local_278._12_4_ = (int)((ulong)dVar43 >> 0x20);
                    paVar23 = aiVector3t<double>::Normalize((aiVector3t<double> *)local_278);
                    local_2f8 = 10000000000.0;
                    if ((1e-05 < ABS(dVar38)) &&
                       (local_2f8 = SQRT((nextBoundaryPoint.z - startingPoint.z) *
                                         (nextBoundaryPoint.z - startingPoint.z) +
                                         (nextBoundaryPoint.x - startingPoint.x) *
                                         (nextBoundaryPoint.x - startingPoint.x) +
                                         (nextBoundaryPoint.y - startingPoint.y) *
                                         (nextBoundaryPoint.y - startingPoint.y)),
                       10000000000.0 <= local_2f8)) {
                      local_2f8 = 10000000000.0;
                    }
                    dVar43 = paVar23->x * dVar9;
                    dVar7 = paVar23->y * dVar9;
                    dVar10 = paVar23->z * dVar9;
                    ::operator*(&proj,(aiVector3t<double> *)e1_1.x);
                    dVar11 = (local_268 - startingPoint.z) * dVar10 +
                             ((double)local_278._0_8_ - startingPoint.x) * dVar43 +
                             dVar7 * ((double)local_278._8_8_ - startingPoint.y);
                    if ((dVar11 <= -1e-06) || (local_2f8 < dVar11)) {
                      uVar19 = 0xffffffffffffffff;
                    }
                    else {
                      dVar8 = ((double)local_278._0_8_ - startingPoint.x) - dVar43 * dVar11;
                      dVar41 = ((double)local_278._8_8_ - startingPoint.y) - dVar7 * dVar11;
                      dVar39 = (local_268 - startingPoint.z) - dVar10 * dVar11;
                      uVar19 = 0xffffffffffffffff;
                      if (dVar39 * dVar39 + dVar8 * dVar8 + dVar41 * dVar41 < 1e-10) {
                        uVar19 = ((long)e1.y - (long)e1.x) / 0x28;
                        local_2f8 = dVar11;
                      }
                    }
                    lVar24 = 8;
                    local_280 = dVar26;
                    for (uVar25 = 0; uVar25 < (ulong)(((long)e1.y - (long)e1.x) / 0x28);
                        uVar25 = uVar25 + 2) {
                      ::operator*(&proj,(aiVector3t<double> *)((long)e1.x + lVar24));
                      dVar26 = (local_268 - startingPoint.z) * dVar10 +
                               ((double)local_278._0_8_ - startingPoint.x) * dVar43 +
                               dVar7 * ((double)local_278._8_8_ - startingPoint.y);
                      if (((-1e-06 < dVar26) && (dVar26 <= local_2f8)) &&
                         (dVar11 = ((double)local_278._0_8_ - startingPoint.x) - dVar43 * dVar26,
                         dVar39 = ((double)local_278._8_8_ - startingPoint.y) - dVar7 * dVar26,
                         dVar8 = (local_268 - startingPoint.z) - dVar10 * dVar26,
                         dVar8 * dVar8 + dVar11 * dVar11 + dVar39 * dVar39 < 1e-10)) {
                        uVar19 = uVar25;
                        local_2f8 = dVar26;
                      }
                      lVar24 = lVar24 + 0x50;
                    }
                    if (uVar19 == 0xffffffffffffffff) {
                      ::operator*(&proj_inv,&nextBoundaryPoint);
                      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                      emplace_back<aiVector3t<double>>
                                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                 &e1_1,(aiVector3t<double> *)local_278);
                      startingPoint.x = nextBoundaryPoint.x;
                      startingPoint.y = nextBoundaryPoint.y;
                      startingPoint.z = nextBoundaryPoint.z;
                      dVar37 = local_280;
                    }
                  } while ((ulong)(((long)e1_1.y - (long)e1_1.x) / 0x18) <=
                           (ulong)(((long)((profile.
                                            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->mVerts).
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)((profile.
                                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->mVerts).
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18 +
                                  ((long)blackside.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)blackside.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x18));
                  LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4e5de6);
LAB_004e5de6:
                } while (uVar19 < (ulong)(((long)e1.y - (long)e1.x) / 0x28));
                WritePolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &e1_1,result);
                std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                ~_Vector_base((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               *)&e1_1);
              }
            }
          }
          else {
            LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4e53db);
          }
          std::
          _Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
          ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                           *)&ei);
          std::
          _Vector_base<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
          ::~_Vector_base((_Vector_base<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                           *)&e1);
        }
      }
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                (&blackside.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                (&whiteside.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
      local_290 = (ulong)((int)local_290 + *puVar18);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4e5ef8);
  }
  else {
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4e5eea);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&profile.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace* hs, TempMesh& result,
                                                       const TempMesh& first_operand,
                                                       ConversionData& conv)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    n.Normalize();

    // obtain the polygonal bounding volume
    std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
    if(!ProcessCurve(hs->PolygonalBoundary, *profile.get(), conv)) {
        IFCImporter::LogError("expected valid polyline for boundary of boolean halfspace");
        return;
    }

    // determine winding order by calculating the normal.
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(profile->mVerts.data(), profile->mVerts.size());

    IfcMatrix4 proj_inv;
    ConvertAxisPlacement(proj_inv,hs->Position);

    // and map everything into a plane coordinate space so all intersection
    // tests can be done in 2D space.
    IfcMatrix4 proj = proj_inv;
    proj.Inverse();

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;
    std::vector<unsigned int>& outvertcnt = result.mVertcnt;

    outvert.reserve(in.size());
    outvertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin();
    std::vector<unsigned int>::const_iterator end = first_operand.mVertcnt.end();
    std::vector<unsigned int>::const_iterator iit;
    for( iit = begin; iit != end; vidx += *iit++ )
    {
        // Our new approach: we cut the poly along the plane, then we intersect the part on the black side of the plane
        // against the bounding polygon. All the white parts, and the black part outside the boundary polygon, are kept.
        std::vector<IfcVector3> whiteside, blackside;

        {
            const IfcVector3* srcVertices = &in[vidx];
            const size_t srcVtxCount = *iit;
            if( srcVtxCount == 0 )
                continue;

            IfcVector3 polyNormal = TempMesh::ComputePolygonNormal(srcVertices, srcVtxCount, true);

            // if the poly is parallel to the plane, put it completely on the black or white side
            if( std::abs(polyNormal * n) > 0.9999 )
            {
                bool isOnWhiteSide = (srcVertices[0] - p) * n > -1e-6;
                std::vector<IfcVector3>& targetSide = isOnWhiteSide ? whiteside : blackside;
                targetSide.insert(targetSide.end(), srcVertices, srcVertices + srcVtxCount);
            }
            else
            {
                // otherwise start building one polygon for each side. Whenever the current line segment intersects the plane
                // we put a point there as an end of the current segment. Then we switch to the other side, put a point there, too,
                // as a beginning of the current segment, and simply continue accumulating vertices.
                bool isCurrentlyOnWhiteSide = ((srcVertices[0]) - p) * n > -1e-6;
                for( size_t a = 0; a < srcVtxCount; ++a )
                {
                    IfcVector3 e0 = srcVertices[a];
                    IfcVector3 e1 = srcVertices[(a + 1) % srcVtxCount];
                    IfcVector3 ei;

                    // put starting point to the current mesh
                    std::vector<IfcVector3>& trgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                    trgt.push_back(srcVertices[a]);

                    // if there's an intersection, put an end vertex there, switch to the other side's mesh,
                    // and add a starting vertex there, too
                    bool isPlaneHit = IntersectSegmentPlane(p, n, e0, e1, isCurrentlyOnWhiteSide, ei);
                    if( isPlaneHit )
                    {
                        if( trgt.empty() || (trgt.back() - ei).SquareLength() > 1e-12 )
                            trgt.push_back(ei);
                        isCurrentlyOnWhiteSide = !isCurrentlyOnWhiteSide;
                        std::vector<IfcVector3>& newtrgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                        newtrgt.push_back(ei);
                    }
                }
            }
        }

        // the part on the white side can be written into the target mesh right away
        WritePolygon(whiteside, result);

        // The black part is the piece we need to get rid of, but only the part of it within the boundary polygon.
        // So we now need to construct all the polygons that result from BlackSidePoly minus BoundaryPoly.
        FilterPolygon(blackside);

        // Complicated, II. We run along the polygon. a) When we're inside the boundary, we run on until we hit an
        // intersection, which means we're leaving it. We then start a new out poly there. b) When we're outside the
        // boundary, we start collecting vertices until we hit an intersection, then we run along the boundary until we hit
        // an intersection, then we switch back to the poly and run on on this one again, and so on until we got a closed
        // loop. Then we continue with the path we left to catch potential additional polys on the other side of the
        // boundary as described in a)
        if( !blackside.empty() )
        {
            // poly edge index, intersection point, edge index in boundary poly
            std::vector<std::tuple<size_t, IfcVector3, size_t> > intersections;
            bool startedInside = PointInPoly(proj * blackside.front(), profile->mVerts);
            bool isCurrentlyInside = startedInside;

            std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;

            for( size_t a = 0; a < blackside.size(); ++a )
            {
                const IfcVector3 e0 = proj * blackside[a];
                const IfcVector3 e1 = proj * blackside[(a + 1) % blackside.size()];

                intersected_boundary.clear();
                IntersectsBoundaryProfile(e0, e1, profile->mVerts, isCurrentlyInside, intersected_boundary);
                // sort the hits by distance from e0 to get the correct in/out/in sequence. Manually :-( I miss you, C++11.
                if( intersected_boundary.size() > 1 )
                {
                    bool keepSorting = true;
                    while( keepSorting )
                    {
                        keepSorting = false;
                        for( size_t b = 0; b < intersected_boundary.size() - 1; ++b )
                        {
                            if( (intersected_boundary[b + 1].second - e0).SquareLength() < (intersected_boundary[b].second - e0).SquareLength() )
                            {
                                keepSorting = true;
                                std::swap(intersected_boundary[b + 1], intersected_boundary[b]);
                            }
                        }
                    }
                }
                // now add them to the list of intersections
                for( size_t b = 0; b < intersected_boundary.size(); ++b )
                    intersections.push_back(std::make_tuple(a, proj_inv * intersected_boundary[b].second, intersected_boundary[b].first));

                // and calculate our new inside/outside state
                if( intersected_boundary.size() & 1 )
                    isCurrentlyInside = !isCurrentlyInside;
            }

            // we got a list of in-out-combinations of intersections. That should be an even number of intersections, or
            // we're fucked.
            if( (intersections.size() & 1) != 0 )
            {
                IFCImporter::LogWarn("Odd number of intersections, can't work with that. Omitting half space boundary check.");
                continue;
            }

            if( intersections.size() > 1 )
            {
                // If we started outside, the first intersection is a out->in intersection. Cycle them so that it
                // starts with an intersection leaving the boundary
                if( !startedInside )
                for( size_t b = 0; b < intersections.size() - 1; ++b )
                    std::swap(intersections[b], intersections[(b + intersections.size() - 1) % intersections.size()]);

                // Filter pairs of out->in->out that lie too close to each other.
                for( size_t a = 0; intersections.size() > 0 && a < intersections.size() - 1; /**/ )
                {
                    if( (std::get<1>(intersections[a]) - std::get<1>(intersections[(a + 1) % intersections.size()])).SquareLength() < 1e-10 )
                        intersections.erase(intersections.begin() + a, intersections.begin() + a + 2);
                    else
                        a++;
                }
                if( intersections.size() > 1 && (std::get<1>(intersections.back()) - std::get<1>(intersections.front())).SquareLength() < 1e-10 )
                {
                    intersections.pop_back(); intersections.erase(intersections.begin());
                }
            }


            // no intersections at all: either completely inside the boundary, so everything gets discarded, or completely outside.
            // in the latter case we're implementional lost. I'm simply going to ignore this, so a large poly will not get any
            // holes if the boundary is smaller and does not touch it anywhere.
            if( intersections.empty() )
            {
                // starting point was outside -> everything is outside the boundary -> nothing is clipped -> add black side
                // to result mesh unchanged
                if( !startedInside )
                {
                    outvertcnt.push_back(static_cast<unsigned int>(blackside.size()));
                    outvert.insert(outvert.end(), blackside.begin(), blackside.end());
                    continue;
                }
                else
                {
                    // starting point was inside the boundary -> everything is inside the boundary -> nothing is spared from the
                    // clipping -> nothing left to add to the result mesh
                    continue;
                }
            }

            // determine the direction in which we're marching along the boundary polygon. If the src poly is faced upwards
            // and the boundary is also winded this way, we need to march *backwards* on the boundary.
            const IfcVector3 polyNormal = IfcMatrix3(proj) * TempMesh::ComputePolygonNormal(blackside.data(), blackside.size());
            bool marchBackwardsOnBoundary = (profileNormal * polyNormal) >= 0.0;

            // Build closed loops from these intersections. Starting from an intersection leaving the boundary we
            // walk along the polygon to the next intersection (which should be an IS entering the boundary poly).
            // From there we walk along the boundary until we hit another intersection leaving the boundary,
            // walk along the poly to the next IS and so on until we're back at the starting point.
            // We remove every intersection we "used up", so any remaining intersection is the start of a new loop.
            while( !intersections.empty() )
            {
                std::vector<IfcVector3> resultpoly;
                size_t currentIntersecIdx = 0;

                while( true )
                {
                    ai_assert(intersections.size() > currentIntersecIdx + 1);
                    std::tuple<size_t, IfcVector3, size_t> currintsec = intersections[currentIntersecIdx + 0];
                    std::tuple<size_t, IfcVector3, size_t> nextintsec = intersections[currentIntersecIdx + 1];
                    intersections.erase(intersections.begin() + currentIntersecIdx, intersections.begin() + currentIntersecIdx + 2);

                    // we start with an in->out intersection
                    resultpoly.push_back(std::get<1>(currintsec));
                    // climb along the polygon to the next intersection, which should be an out->in
                    size_t numPolyPoints = (std::get<0>(currintsec) > std::get<0>(nextintsec) ? blackside.size() : 0)
                        + std::get<0>(nextintsec) - std::get<0>(currintsec);
                    for( size_t a = 1; a <= numPolyPoints; ++a )
                        resultpoly.push_back(blackside[(std::get<0>(currintsec) + a) % blackside.size()]);
                    // put the out->in intersection
                    resultpoly.push_back(std::get<1>(nextintsec));

                    // generate segments along the boundary polygon that lie in the poly's plane until we hit another intersection
                    IfcVector3 startingPoint = proj * std::get<1>(nextintsec);
                    size_t currentBoundaryEdgeIdx = (std::get<2>(nextintsec) + (marchBackwardsOnBoundary ? 1 : 0)) % profile->mVerts.size();
                    size_t nextIntsecIdx = SIZE_MAX;
                    while( nextIntsecIdx == SIZE_MAX )
                    {
                        IfcFloat t = 1e10;

                        size_t nextBoundaryEdgeIdx = marchBackwardsOnBoundary ? (currentBoundaryEdgeIdx + profile->mVerts.size() - 1) : currentBoundaryEdgeIdx + 1;
                        nextBoundaryEdgeIdx %= profile->mVerts.size();
                        // vertices of the current boundary segments
                        IfcVector3 currBoundaryPoint = profile->mVerts[currentBoundaryEdgeIdx];
                        IfcVector3 nextBoundaryPoint = profile->mVerts[nextBoundaryEdgeIdx];
                        // project the two onto the polygon
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            currBoundaryPoint.z = startingPoint.z + (currBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (currBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                            nextBoundaryPoint.z = startingPoint.z + (nextBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (nextBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                        }

                        // build a direction that goes along the boundary border but lies in the poly plane
                        IfcVector3 boundaryPlaneNormal = ((nextBoundaryPoint - currBoundaryPoint) ^ profileNormal).Normalize();
                        IfcVector3 dirAtPolyPlane = (boundaryPlaneNormal ^ polyNormal).Normalize() * (marchBackwardsOnBoundary ? -1.0 : 1.0);
                        // if we can project the direction to the plane, we can calculate a maximum marching distance along that dir
                        // until we finish that boundary segment and continue on the next
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            t = std::min(t, (nextBoundaryPoint - startingPoint).Length());
                        }

                        // check if the direction hits the loop start - if yes, we got a poly to output
                        IfcVector3 dirToThatPoint = proj * resultpoly.front() - startingPoint;
                        IfcFloat tpt = dirToThatPoint * dirAtPolyPlane;
                        if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                        {
                            nextIntsecIdx = intersections.size(); // dirty hack to end marching along the boundary and signal the end of the loop
                            t = tpt;
                        }

                        // also check if the direction hits any in->out intersections earlier. If we hit one, we can switch back
                        // to marching along the poly border from that intersection point
                        for( size_t a = 0; a < intersections.size(); a += 2 )
                        {
                            dirToThatPoint = proj * std::get<1>(intersections[a]) - startingPoint;
                            tpt = dirToThatPoint * dirAtPolyPlane;
                            if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                            {
                                nextIntsecIdx = a; // switch back to poly and march on from this in->out intersection
                                t = tpt;
                            }
                        }

                        // if we keep marching on the boundary, put the segment end point to the result poly and well... keep marching
                        if( nextIntsecIdx == SIZE_MAX )
                        {
                            resultpoly.push_back(proj_inv * nextBoundaryPoint);
                            currentBoundaryEdgeIdx = nextBoundaryEdgeIdx;
                            startingPoint = nextBoundaryPoint;
                        }

                        // quick endless loop check
                        if( resultpoly.size() > blackside.size() + profile->mVerts.size() )
                        {
                            IFCImporter::LogError("Encountered endless loop while clipping polygon against poly-bounded half space.");
                            break;
                        }
                    }

                    // we're back on the poly - if this is the intersection we started from, we got a closed loop.
                    if( nextIntsecIdx >= intersections.size() )
                    {
                        break;
                    }

                    // otherwise it's another intersection. Continue marching from there.
                    currentIntersecIdx = nextIntsecIdx;
                }

                WritePolygon(resultpoly, result);
            }
        }
    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping with polygonal bounding (IfcBooleanClippingResult)");
}